

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::GlobalValueChangeFunc::~GlobalValueChangeFunc(GlobalValueChangeFunc *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~GlobalValueChangeFunc((GlobalValueChangeFunc *)0x13732c8);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

GlobalValueChangeFunc(KnownSystemName knownNameId, bool isFuture) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), isFuture(isFuture) {}